

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PalindromeTester.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  uint uVar2;
  char *__s;
  uint local_2c;
  
  printf("%s","Enter a 5 digit number: ");
  __isoc99_scanf("%d",&local_2c);
  if (0x15f8d < local_2c - 0x2711) {
    do {
      puts("You did not provide a 5 digit number!!!");
      printf("%s","Enter a 5 digit number: ");
      __isoc99_scanf("%d",&local_2c);
    } while (0x15f8d < local_2c - 0x2711);
  }
  uVar2 = local_2c / 10000;
  uVar1 = local_2c % 10000;
  local_2c = (uVar1 % 1000) % 100;
  __s = "The given number is a palindrome!!!";
  if ((short)(uVar1 / 1000) != (short)(local_2c / 10)) {
    __s = "Not a palindrome!!!";
  }
  if (uVar2 != (byte)((char)local_2c + (char)(local_2c / 10) * -10)) {
    __s = "Not a palindrome!!!";
  }
  puts(__s);
  return 0;
}

Assistant:

int main (void) {
    int number;
    int flag = 1;
    int numA;
    int numB;
    int numC;
    int numD;

    printf("%s", "Enter a 5 digit number: ");
    scanf("%d", &number);
    while (flag != -1) {
        if (number > 10000) {
            if (number < 99999) {
                numA = number / 10000;
                number = number % 10000;
                numB = number / 1000;
                number = number % 1000;
                number = number % 100;
                numC = number / 10;
                numD = number % 10;
                if (numA == numD) {
                    if (numB == numC) {
                        puts("The given number is a palindrome!!!");

                    }
                    else
                        puts("Not a palindrome!!!");

                }
                else
                    puts("Not a palindrome!!!");

                flag = -1;

            }
            else {
                puts("You did not provide a 5 digit number!!!");
                printf("%s", "Enter a 5 digit number: ");
                scanf("%d", &number);

            }

        }
        else {
            puts("You did not provide a 5 digit number!!!");
            printf("%s", "Enter a 5 digit number: ");
            scanf("%d", &number);

        }

    }

    return 0;

}